

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddLCache.c
# Opt level: O0

void cuddLocalCacheInsert(DdLocalCache *cache,DdNodePtr *key,DdNode *value)

{
  uint uVar1;
  undefined8 *puVar2;
  DdLocalCacheItem *entry;
  uint posn;
  DdNode *value_local;
  DdNodePtr *key_local;
  DdLocalCache *cache_local;
  
  uVar1 = ddLCHash(key,cache->keysize,cache->shift);
  puVar2 = (undefined8 *)((long)cache->item->key + ((ulong)(uVar1 * cache->itemsize) - 8));
  memcpy(puVar2 + 1,key,(ulong)cache->keysize << 3);
  *puVar2 = value;
  return;
}

Assistant:

void
cuddLocalCacheInsert(
  DdLocalCache * cache,
  DdNodePtr * key,
  DdNode * value)
{
    unsigned int posn;
    DdLocalCacheItem *entry;

    posn = ddLCHash(key,cache->keysize,cache->shift);
    entry = (DdLocalCacheItem *) ((char *) cache->item +
                                  posn * cache->itemsize);
    memcpy(entry->key,key,cache->keysize * sizeof(DdNode *));
    entry->value = value;
#ifdef DD_CACHE_PROFILE
    entry->count++;
#endif

}